

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_callstack.c
# Opt level: O2

void ht_feature_callstack_stop(HT_Timeline *timeline)

{
  void *pvVar1;
  void *pvVar2;
  HT_ThreadId HVar3;
  HT_FeatureCallstack *pHVar4;
  HT_TimestampNs HVar5;
  
  pHVar4 = HT_FeatureCallstack_from_timeline(timeline);
  pvVar1 = (pHVar4->stack).data;
  pvVar2 = (pHVar4->stack).sizes_stack.data[(pHVar4->stack).sizes_stack.size - 1];
  HVar5 = ht_monotonic_clock_get_timestamp();
  *(HT_TimestampNs *)((long)pvVar1 + 0x18 + (long)pvVar2) =
       HVar5 - *(long *)((long)pvVar1 + 8 + (long)pvVar2);
  HVar3 = ht_thread_get_current_thread_id();
  *(HT_ThreadId *)((long)pvVar1 + 0x20 + (long)pvVar2) = HVar3;
  ht_timeline_push_event(timeline,(HT_Event *)((long)pvVar1 + (long)pvVar2));
  ht_stack_pop(&pHVar4->stack);
  return;
}

Assistant:

void
ht_feature_callstack_stop(HT_Timeline* timeline)
{
    HT_FeatureCallstack* f = HT_FeatureCallstack_from_timeline(timeline);
    HT_CallstackBaseEvent* event = (HT_CallstackBaseEvent*)ht_stack_top(&f->stack);

    event->duration = ht_monotonic_clock_get_timestamp() - HT_EVENT(event)->timestamp;
    event->thread_id = ht_thread_get_current_thread_id();

    ht_timeline_push_event((HT_Timeline*)timeline, HT_EVENT(event));

    ht_stack_pop(&f->stack);
}